

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O2

bool ON_RTree::Search(ON_RTree *a_rtreeA,ON_RTree *a_rtreeB,double tolerance,
                     ON_SimpleArray<ON_2dex> *a_result)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  ON_RTreePairSearchResult r;
  ON_RTreePairSearchResult local_30;
  
  bVar2 = a_rtreeA->m_root != (ON_RTreeNode *)0x0;
  bVar3 = a_rtreeB->m_root != (ON_RTreeNode *)0x0;
  if (bVar3 && bVar2) {
    bVar1 = ON_IsValid(tolerance);
    local_30.m_tolerance = tolerance;
    if (!bVar1) {
      local_30.m_tolerance = 0.0;
    }
    local_30.m_tolerance = (double)(-(ulong)(0.0 < tolerance) & (ulong)local_30.m_tolerance);
    local_30.m_result = a_result;
    PairSearchHelper(a_rtreeA->m_root,a_rtreeB->m_root,&local_30);
  }
  return bVar3 && bVar2;
}

Assistant:

bool ON_RTree::Search( 
          const ON_RTree& a_rtreeA,
          const ON_RTree& a_rtreeB, 
          double tolerance,
          ON_SimpleArray<ON_2dex>& a_result
          )
{
  if ( 0 == a_rtreeA.m_root )
    return false;
  if ( 0 == a_rtreeB.m_root )
    return false;
  ON_RTreePairSearchResult r;
  r.m_tolerance = (ON_IsValid(tolerance) && tolerance > 0.0) ? tolerance : 0.0;
  r.m_result = &a_result;
  PairSearchHelper(a_rtreeA.m_root,a_rtreeB.m_root,&r);
  return true;
}